

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_validity_cb(lws_sorted_usec_list_t *sul)

{
  char cVar1;
  sul_cb_t p_Var2;
  lws_dll2 *plVar3;
  lws *wsi_00;
  lws_retry_bo_t *rbo;
  lws_context_per_thread *pt;
  lws *wsi;
  lws_sorted_usec_list_t *sul_local;
  
  wsi_00 = (lws *)(sul + -8);
  p_Var2 = sul[4].cb;
  cVar1 = *(char *)((long)&sul[10].cb + 5);
  plVar3 = sul[6].list.next;
  if ((*(ulong *)((long)&sul[10].list.next + 4) >> 0x29 & 1) == 0) {
    _lws_log(8,"%s: wsi %p: scheduling validity check\n","lws_validity_cb",wsi_00);
    if ((sul[5].cb != (sul_cb_t)0x0) && (*(long *)(sul[5].cb + 0xa8) != 0)) {
      (**(code **)(sul[5].cb + 0xa8))(wsi_00,0);
    }
    if (*(ushort *)((long)&plVar3->next + 6) <= *(ushort *)((long)&plVar3->next + 4)) {
      __assert_fail("rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi-timeout.c"
                    ,0x134,"void lws_validity_cb(lws_sorted_usec_list_t *)");
    }
    *(ulong *)((long)&sul[10].list.next + 4) =
         *(ulong *)((long)&sul[10].list.next + 4) & 0xfffffdffffffffff | 0x20000000000;
    __lws_sul_insert((lws_dll2_owner_t *)(p_Var2 + (long)(int)cVar1 * 0x188 + 0x1c8),sul,
                     ((ulong)*(ushort *)((long)&plVar3->next + 6) -
                     (ulong)*(ushort *)((long)&plVar3->next + 4)) * 1000000);
  }
  else {
    _lws_log(8,"%s: wsi %p: validity too old\n","lws_validity_cb",wsi_00);
    __lws_close_free_wsi(wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"validity timeout");
  }
  return;
}

Assistant:

static void
lws_validity_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_validity);
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	const lws_retry_bo_t *rbo = wsi->retry_policy;

	/* one of either the ping or hangup validity threshold was crossed */

	if (wsi->validity_hup) {
		lwsl_info("%s: wsi %p: validity too old\n", __func__, wsi);
		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				     "validity timeout");
		return;
	}

	/* schedule a protocol-dependent ping */

	lwsl_info("%s: wsi %p: scheduling validity check\n", __func__, wsi);

	if (wsi->role_ops && wsi->role_ops->issue_keepalive)
		wsi->role_ops->issue_keepalive(wsi, 0);

	/*
	 * We arrange to come back here after the additional ping to hangup time
	 * and do the hangup, unless we get validated (by, eg, a PONG) and
	 * reset the timer
	 */

	assert(rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping);

	wsi->validity_hup = 1;
	__lws_sul_insert(&pt->pt_sul_owner, &wsi->sul_validity,
			 ((uint64_t)rbo->secs_since_valid_hangup -
				 rbo->secs_since_valid_ping) * LWS_US_PER_SEC);
}